

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptString.cpp
# Opt level: O3

int Js::JavascriptString::IndexOf
              (ArgumentReader *args,ScriptContext *scriptContext,char16 *apiNameForErrorMsg,
              bool isRegExpAnAllowedArg)

{
  Type searchLen;
  bool bVar1;
  BOOL BVar2;
  charcount_t cVar3;
  int iVar4;
  Var pvVar5;
  char16 *searchStr;
  char16 *pcVar6;
  char *pcVar7;
  charcount_t position;
  Boyer_Moore_Jump local_258 [2];
  JmpTable jmpTable;
  JavascriptString *local_50;
  JavascriptString *pThis;
  JavascriptString *searchString;
  charcount_t local_34;
  
  GetThisAndSearchStringArguments
            (args,scriptContext,apiNameForErrorMsg,&local_50,&pThis,isRegExpAnAllowedArg);
  local_34 = local_50->m_charLength;
  searchString = pThis;
  searchLen = pThis->m_charLength;
  position = 0;
  if (2 < (*(uint *)&(args->super_Arguments).Info & 0xffffff)) {
    pvVar5 = Arguments::operator[](&args->super_Arguments,2);
    BVar2 = JavascriptOperators::IsUndefinedObject(pvVar5);
    if (BVar2 == 0) {
      pvVar5 = Arguments::operator[](&args->super_Arguments,2);
      cVar3 = ConvertToIndex(pvVar5,scriptContext);
      position = 0;
      if (0 < (int)cVar3) {
        position = cVar3;
      }
      if ((int)local_34 <= (int)position) {
        position = local_34;
      }
    }
  }
  if (searchLen != 0) {
    iVar4 = GetLengthAsSignedInt(local_50);
    if ((int)position < iVar4) {
      searchStr = GetString(searchString);
      pcVar6 = GetString(local_50);
      if (searchLen != 1) {
        bVar1 = BuildLastCharForwardBoyerMooreTable(local_258,searchStr,searchLen);
        if (bVar1) {
          iVar4 = IndexOfUsingJmpTable(local_258,pcVar6,local_34,searchStr,searchLen,position);
          return iVar4;
        }
        pcVar7 = strstr((char *)local_50,(char *)searchString);
        return (int)pcVar7;
      }
      if ((int)position < (int)local_34) {
        pcVar6 = pcVar6 + (int)position;
        do {
          if (*pcVar6 == *searchStr) {
            return position;
          }
          position = position + 1;
          pcVar6 = pcVar6 + 1;
        } while (local_34 != position);
      }
    }
    position = 0xffffffff;
  }
  return position;
}

Assistant:

int JavascriptString::IndexOf(ArgumentReader& args, ScriptContext* scriptContext, const char16* apiNameForErrorMsg, bool isRegExpAnAllowedArg)
    {
        // The algorithm steps in the spec are the same between String.prototype.indexOf and
        // String.prototype.includes, except that includes returns true if an index is found,
        // false otherwise.  Share the implementation between these two APIs.
        //
        // 1.  Call CheckObjectCoercible passing the this value as its argument.
        // 2.  Let S be the result of calling ToString, giving it the this value as its argument.
        // 3.  Let searchStr be ToString(searchString).
        // 4.  Let pos be ToInteger(position). (If position is undefined, this step produces the value 0).
        // 5.  Let len be the number of characters in S.
        // 6.  Let start be min(max(pos, 0), len).
        // 7.  Let searchLen be the number of characters in searchStr.
        // 8.  Return the smallest possible integer k not smaller than start such that k+ searchLen is not greater than len, and for all nonnegative integers j less than searchLen, the character at position k+j of S is the same as the character at position j of searchStr); but if there is no such integer k, then return the value -1.
        // NOTE
        // The indexOf function is intentionally generic; it does not require that its this value be a String object. Therefore, it can be transferred to other kinds of objects for use as a method.
        //

        JavascriptString * pThis;
        JavascriptString * searchString;

        GetThisAndSearchStringArguments(args, scriptContext, apiNameForErrorMsg, &pThis, &searchString, isRegExpAnAllowedArg);

        int len = pThis->GetLength();
        int searchLen = searchString->GetLength();

        int position = 0;

        if (args.Info.Count > 2)
        {
            if (JavascriptOperators::IsUndefinedObject(args[2]))
            {
                position = 0;
            }
            else
            {
                position = ConvertToIndex(args[2], scriptContext); // this is to adjust corner cases like MAX_VALUE
                position = min(max(position, 0), len);  // adjust position within string limits
            }
        }

        // Zero length search strings are always found at the current search position
        if (searchLen == 0)
        {
            return position;
        }

        int result = -1;

        if (position < pThis->GetLengthAsSignedInt())
        {
            const char16* searchStr = searchString->GetString();
            const char16* inputStr = pThis->GetString();
            if (searchLen == 1)
            {
                int i = position;
                for(; i < len && inputStr[i] != *searchStr ; i++);
                if (i < len)
                {
                    result = i;
                }
            }
            else
            {
                JmpTable jmpTable;
                bool fAsciiJumpTable = BuildLastCharForwardBoyerMooreTable(jmpTable, searchStr, searchLen);
                if (!fAsciiJumpTable)
                {
                    result = JavascriptString::strstr(pThis, searchString, false, position);
                }
                else
                {
                    result = IndexOfUsingJmpTable(jmpTable, inputStr, len, searchStr, searchLen, position);
                }
            }
        }
        return result;
    }